

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O0

string * __thiscall
duckdb::ART::GenerateConstraintErrorMessage
          (ART *this,VerifyExistenceType verify_type,string *key_name)

{
  bool bVar1;
  char *pcVar2;
  string *msg;
  string *in_RCX;
  char in_DL;
  string *in_RDI;
  string type;
  Index *in_stack_fffffffffffffe40;
  allocator *this_00;
  allocator local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  allocator local_129;
  string local_128 [32];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  string *local_20;
  
  local_20 = in_RCX;
  if (in_DL == '\0') {
    bVar1 = Index::IsPrimary(in_stack_fffffffffffffe40);
    pcVar2 = "unique";
    if (bVar1) {
      pcVar2 = "primary key";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,pcVar2,&local_41);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_78,"Duplicate key \"%s\" violates %s constraint.",&local_79);
    ::std::__cxx11::string::string(local_a0,local_20);
    ::std::__cxx11::string::string(local_c0,local_40);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    ::std::__cxx11::string::~string(local_c0);
    ::std::__cxx11::string::~string(local_a0);
    ::std::__cxx11::string::~string(local_78);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
    ::std::__cxx11::string::~string(local_40);
  }
  else if (in_DL == '\x01') {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_e0,
               "Violates foreign key constraint because key \"%s\" does not exist in the referenced table"
               ,&local_e1);
    ::std::__cxx11::string::string(local_108,local_20);
    StringUtil::Format<std::__cxx11::string>(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    ::std::__cxx11::string::~string(local_108);
    ::std::__cxx11::string::~string(local_e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  else {
    if (in_DL != '\x02') {
      msg = (string *)__cxa_allocate_exception(0x10);
      this_00 = &local_171;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe90,"Type not implemented for VerifyExistenceType",
                 this_00);
      NotImplementedException::NotImplementedException((NotImplementedException *)this_00,msg);
      __cxa_throw(msg,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_128,
               "Violates foreign key constraint because key \"%s\" is still referenced by a foreign key in a different table. If this is an unexpected constraint violation, please refer to our foreign key limitations in the documentation"
               ,&local_129);
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffffeb0,local_20);
    StringUtil::Format<std::__cxx11::string>(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
    ::std::__cxx11::string::~string(local_128);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  return in_RDI;
}

Assistant:

string ART::GenerateConstraintErrorMessage(VerifyExistenceType verify_type, const string &key_name) {
	switch (verify_type) {
	case VerifyExistenceType::APPEND: {
		// APPEND to PK/UNIQUE table, but node/key already exists in PK/UNIQUE table.
		string type = IsPrimary() ? "primary key" : "unique";
		return StringUtil::Format("Duplicate key \"%s\" violates %s constraint.", key_name, type);
	}
	case VerifyExistenceType::APPEND_FK: {
		// APPEND_FK to FK table, node/key does not exist in PK/UNIQUE table.
		return StringUtil::Format(
		    "Violates foreign key constraint because key \"%s\" does not exist in the referenced table", key_name);
	}
	case VerifyExistenceType::DELETE_FK: {
		// DELETE_FK that still exists in a FK table, i.e., not a valid delete.
		return StringUtil::Format(
		    "Violates foreign key constraint because key \"%s\" is still referenced by a foreign "
		    "key in a different table. If this is an unexpected constraint violation, please refer to our "
		    "foreign key limitations in the documentation",
		    key_name);
	}
	default:
		throw NotImplementedException("Type not implemented for VerifyExistenceType");
	}
}